

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_invalidModelAttribute_Test::~Parser_invalidModelAttribute_Test
          (Parser_invalidModelAttribute_Test *this)

{
  Parser_invalidModelAttribute_Test *this_local;
  
  ~Parser_invalidModelAttribute_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, invalidModelAttribute)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" game=\"model_name\"/>\n";
    const std::vector<std::string> expectedIssues = {
        "Model '' has an invalid attribute 'game'.",
        "Model does not have a name attribute.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);
    EXPECT_EQ_ISSUES(expectedIssues, p);
}